

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O1

TProb Cipher::calcScore0(TParameters *params,TFreqMap *freqMap,TClusters *txt,
                        TClusterToLetterMap *clMap)

{
  uint uVar1;
  pointer pdVar2;
  float fVar3;
  char cVar4;
  TProb TVar5;
  uint uVar6;
  uint *puVar7;
  undefined4 *puVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  float fVar16;
  double dVar17;
  float fVar18;
  vector<int,_std::allocator<int>_> plain;
  array<int,_27UL> letCount;
  allocator_type local_d1;
  TProb local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  TFreqMap *local_b0;
  int local_a8 [30];
  
  local_d0 = (TProb)((ulong)((long)(txt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(txt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  iVar11 = SUB84(local_d0,0);
  std::vector<int,_std::allocator<int>_>::vector(&local_c8,(long)iVar11,&local_d1);
  fVar18 = 0.0;
  if (0 < iVar11) {
    uVar13 = (ulong)(SUB84(local_d0,0) & 0x7fffffff);
    lVar14 = 0;
    iVar11 = 0;
    local_b0 = freqMap;
    do {
      puVar7 = (uint *)std::
                       map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                       at(clMap,(key_type_conflict *)
                                ((long)(txt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + lVar14));
      uVar10 = *puVar7;
      *(uint *)((long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar14) = uVar10;
      if (uVar10 - 1 < 0x1a) {
        local_a8[uVar10] = local_a8[uVar10] + 1;
LAB_0013de77:
        iVar11 = iVar11 + 1;
      }
      else if (params->includeSpaces == true) {
        local_a8[0] = local_a8[0] + 1;
        goto LAB_0013de77;
      }
      lVar14 = lVar14 + 4;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
    fVar18 = (float)iVar11;
    freqMap = local_b0;
  }
  TVar5 = local_d0;
  fVar16 = 0.0;
  puVar8 = &(anonymous_namespace)::kEnglishLetterFreq;
  if (params->includeSpaces != false) {
    puVar8 = &(anonymous_namespace)::kEnglishLetterWithSpacesFreq;
  }
  lVar14 = 0;
  do {
    fVar3 = (float)puVar8[lVar14] * 0.01 - (float)local_a8[lVar14] / fVar18;
    fVar16 = fVar16 + fVar3 * fVar3;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x1b);
  fVar16 = fVar16 / 27.0;
  if (fVar16 < 0.0) {
    fVar16 = sqrtf(fVar16);
  }
  else {
    fVar16 = SQRT(fVar16);
  }
  iVar11 = freqMap->len;
  cVar4 = (char)iVar11;
  iVar15 = SUB84(TVar5,0);
  if (iVar11 < 1) {
    dVar17 = 0.0;
    uVar13 = 0;
    uVar10 = 0;
  }
  else {
    uVar13 = 0;
    uVar12 = 0;
    if (0 < iVar15) {
      uVar12 = (ulong)TVar5 & 0xffffffff;
    }
    dVar17 = 0.0;
    local_d0 = -1e+100;
    uVar10 = 0;
    do {
      if (uVar12 == uVar13) {
LAB_0013e012:
        if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        return local_d0;
      }
      uVar1 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar13] - 1;
      iVar11 = iVar11 - (uint)(uVar1 < 0x1a);
      if (0x19 < uVar1) {
        dVar17 = dVar17 + params->pNonAlphabetic;
      }
      if (uVar1 < 0x1a) {
        uVar10 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13] + uVar10 * 0x20;
      }
      uVar13 = uVar13 + 1;
    } while (0 < iVar11);
  }
  pdVar2 = (freqMap->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar17 = dVar17 + pdVar2[(int)uVar10];
  do {
    uVar10 = uVar10 & ~(-1 << (cVar4 * '\x05' - 5U & 0x1f));
    iVar9 = (int)uVar13;
    iVar11 = iVar15;
    if (iVar15 < iVar9) {
      iVar11 = iVar9;
    }
    lVar14 = 0;
    do {
      if ((long)iVar11 - (long)iVar9 == lVar14) {
        local_d0 = dVar17 / (double)iVar15 - (double)(fVar16 * params->wEnglishFreq);
        goto LAB_0013e012;
      }
      uVar1 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar9 + lVar14] - 1;
      uVar6 = uVar10 * 0x20 +
              local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar9 + lVar14];
      if (0x19 < uVar1) {
        dVar17 = dVar17 + params->pNonAlphabetic;
        uVar6 = uVar10;
      }
      uVar10 = uVar6;
      lVar14 = lVar14 + 1;
    } while (0x19 < uVar1);
    uVar13 = (ulong)(uint)(iVar9 + (int)lVar14);
    dVar17 = dVar17 + pdVar2[(int)uVar10];
  } while( true );
}

Assistant:

TProb calcScore0(const TParameters & params, const TFreqMap & freqMap, const TClusters & txt, const TClusterToLetterMap & clMap) {
        const int n = txt.size();
        const auto & len  = freqMap.len;
        const auto & prob = freqMap.prob;

        int nlet = 0;
        std::array<int, 27> letCount;
        letCount.fill(0);
        std::vector<TLetter> plain(n);
        for (int i = 0; i < n; ++i) {
            plain[i] = clMap.at(txt[i]);
            if (plain[i] > 0 && plain[i] <= 26) {
                ++letCount[plain[i]];
                ++nlet;
            } else if (params.includeSpaces) {
                ++letCount[0];
                ++nlet;
            }
        }

        float letFreqCost = 0.0;
        {
            auto & freq = params.includeSpaces ? kEnglishLetterWithSpacesFreq : kEnglishLetterFreq;
            for (int i = 0; i < 27; ++i) {
                float curf = 0.01*freq[i] - ((float)(letCount[i]))/((float)(nlet));
                letFreqCost += curf*curf;
            }
        }

        letFreqCost /= 27.0;
        letFreqCost = sqrt(letFreqCost);
        //printf("letFreqCost = %g\n", letFreqCost);

        int i1 = 0;
        int k = len;
        TCode curc = 0;
        TCode mask = (1 << 5*(len-1)) - 1;

        TProb res = 0.0;

        while (k > 0) {
            if (i1 >= n) return -1e100;
            auto c = plain[i1++];
            if (c > 0 && c <= 26) {
                curc <<= 5;
                curc += c;
                --k;
            } else {
                res += params.pNonAlphabetic;
            }
        }

        res += prob[curc];
        while (true) {
            curc &= mask;

            while (true) {
                if (i1 >= n) return res/n - params.wEnglishFreq*letFreqCost;
                auto c = plain[i1++];
                if (c > 0 && c <= 26) {
                    curc <<= 5;
                    curc += c;
                    break;
                } else {
                    res += params.pNonAlphabetic;
                }
            }

            res += prob[curc];
        }

        return res/n - params.wEnglishFreq*letFreqCost;
    }